

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void jinit_marker_writer(j_compress_ptr cinfo)

{
  undefined8 *puVar1;
  long in_RDI;
  my_marker_ptr marker;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x40);
  *(undefined8 **)(in_RDI + 0x210) = puVar1;
  *puVar1 = write_file_header;
  puVar1[1] = write_frame_header;
  puVar1[2] = write_scan_header;
  puVar1[3] = write_file_trailer;
  puVar1[4] = write_tables_only;
  puVar1[5] = write_marker_header;
  puVar1[6] = write_marker_byte;
  *(undefined4 *)(puVar1 + 7) = 0;
  return;
}

Assistant:

GLOBAL(void)
jinit_marker_writer (j_compress_ptr cinfo)
{
  my_marker_ptr marker;

  /* Create the subobject */
  marker = (my_marker_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_marker_writer));
  cinfo->marker = (struct jpeg_marker_writer *) marker;
  /* Initialize method pointers */
  marker->pub.write_file_header = write_file_header;
  marker->pub.write_frame_header = write_frame_header;
  marker->pub.write_scan_header = write_scan_header;
  marker->pub.write_file_trailer = write_file_trailer;
  marker->pub.write_tables_only = write_tables_only;
  marker->pub.write_marker_header = write_marker_header;
  marker->pub.write_marker_byte = write_marker_byte;
  /* Initialize private state */
  marker->last_restart_interval = 0;
}